

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3WindowCodeStep(Parse *pParse,Select *p,WhereInfo *pWInfo,int regGosub,int addrGosub)

{
  Parse *pMWin_00;
  ExprList *pOrderBy_00;
  int iVar1;
  int iVar2;
  int p1;
  int iVar3;
  int iVar4;
  int iVar5;
  Vdbe *p_00;
  KeyInfo *pP4;
  bool bVar6;
  int local_138;
  int addrStart_1;
  int addrBreak;
  int addrBreak3;
  int addrBreak2;
  int addrBreak1;
  int addrStart;
  int bRPS_1;
  int lbl_1;
  int addr_1;
  int bRPS;
  int addrNext;
  int lbl;
  int addrGe;
  int op;
  KeyInfo *pKeyInfo;
  int regNewPart;
  int nPart;
  ExprList *pPart;
  int addr;
  int nPeer;
  int regEnd;
  int regStart;
  int lblWhereEnd;
  WindowCodeArg s;
  int local_74;
  int local_70;
  int regFlushPart;
  int regPeer;
  int regNewPeer;
  int regRecord;
  int regNew;
  int addrEmpty;
  int addrInteger;
  int addrGosubFlush;
  int addrNe;
  int iInput;
  int nInput;
  int csrInput;
  int csrWrite;
  Vdbe *v;
  ExprList *pOrderBy;
  Window *pMWin;
  int addrGosub_local;
  int regGosub_local;
  WhereInfo *pWInfo_local;
  Select *p_local;
  Parse *pParse_local;
  
  pMWin_00 = (Parse *)p->pWin;
  pOrderBy_00 = *(ExprList **)&pMWin_00->rc;
  p_00 = sqlite3GetVdbe(pParse);
  iVar5 = p->pSrc->a[0].iCursor;
  iVar1 = (int)(p->pSrc->a[0].pTab)->nCol;
  addrEmpty = 0;
  regNew = 0;
  regFlushPart = 0;
  local_70 = 0;
  local_74 = 0;
  nPeer = 0;
  addr = 0;
  iVar2 = sqlite3VdbeMakeLabel(pParse);
  s.addrGosub = 0;
  s.regGosub = 0;
  s.current.reg = 0;
  s.end.csr = 0;
  s.pVdbe = (Vdbe *)CONCAT44(regGosub,addrGosub);
  s.start.csr = *(int *)&pMWin_00->pConstExpr;
  s.regRowid = 0;
  p1 = s.start.csr + 1;
  s.eDelete = s.start.csr + 2;
  s.regArg = 0;
  s.current.csr = s.start.csr + 3;
  s.start.reg = 0;
  _regStart = pParse;
  s.pParse = pMWin_00;
  s.pMWin = (Window *)p_00;
  if (pMWin_00->mayAbort == 'V') {
    if ((pMWin_00->isMultiWrite != 'Y') &&
       (iVar4 = windowExprGtZero(pParse,*(Expr **)&pMWin_00->nRangeReg), iVar4 != 0)) {
      s.regGosub = 1;
    }
  }
  else if (pMWin_00->mayAbort == 'Z') {
    iVar4 = windowCacheFrame((Window *)pMWin_00);
    if (iVar4 == 0) {
      if (pMWin_00->hasCompound == 'X') {
        if ((pMWin_00->isMultiWrite != 'Y') &&
           (iVar4 = windowExprGtZero(pParse,*(Expr **)&pMWin_00->nErr), iVar4 != 0)) {
          s.regGosub = 3;
        }
      }
      else {
        s.regGosub = 1;
      }
    }
  }
  else {
    s.addrGosub = 0;
    s.regGosub = 2;
  }
  iVar3 = pParse->nMem + 1;
  pParse->nMem = iVar1 + pParse->nMem;
  iVar4 = pParse->nMem + 1;
  pParse->nMem = iVar4;
  s.regArg = pParse->nMem + 1;
  pParse->nMem = s.regArg;
  if ((pMWin_00->mayAbort == 'X') || (pMWin_00->mayAbort == 'V')) {
    nPeer = pParse->nMem + 1;
    pParse->nMem = nPeer;
  }
  if ((pMWin_00->hasCompound == 'X') || (pMWin_00->hasCompound == 'V')) {
    addr = pParse->nMem + 1;
    pParse->nMem = addr;
  }
  if (pMWin_00->isMultiWrite != 'L') {
    if (pOrderBy_00 == (ExprList *)0x0) {
      local_138 = 0;
    }
    else {
      local_138 = pOrderBy_00->nExpr;
    }
    regFlushPart = iVar3 + (pMWin_00->constraintName).n;
    if (pMWin_00->pVdbe != (Vdbe *)0x0) {
      regFlushPart = *(int *)&pMWin_00->pVdbe->db + regFlushPart;
    }
    local_70 = pParse->nMem + 1;
    pParse->nMem = local_138 + pParse->nMem;
    s.regRowid = pParse->nMem + 1;
    pParse->nMem = local_138 + pParse->nMem;
    s.start.reg = pParse->nMem + 1;
    pParse->nMem = local_138 + pParse->nMem;
    s.current.reg = pParse->nMem + 1;
    pParse->nMem = local_138 + pParse->nMem;
  }
  for (addrGosubFlush = 0; addrGosubFlush < iVar1; addrGosubFlush = addrGosubFlush + 1) {
    sqlite3VdbeAddOp3(p_00,0x5e,iVar5,addrGosubFlush,iVar3 + addrGosubFlush);
  }
  sqlite3VdbeAddOp3(p_00,0x61,iVar3,iVar1,iVar4);
  if (pMWin_00->pVdbe != (Vdbe *)0x0) {
    iVar5 = *(int *)&pMWin_00->pVdbe->db;
    iVar3 = iVar3 + (pMWin_00->constraintName).n;
    pP4 = sqlite3KeyInfoFromExprList(pParse,(ExprList *)pMWin_00->pVdbe,0,0);
    local_74 = pParse->nMem + 1;
    pParse->nMem = local_74;
    iVar1 = sqlite3VdbeAddOp3(p_00,0x5a,iVar3,*(int *)((long)&pMWin_00->pIdxPartExpr + 4),iVar5);
    sqlite3VdbeAppendP4(p_00,pP4,-8);
    sqlite3VdbeAddOp3(p_00,0xe,iVar1 + 2,iVar1 + 4,iVar1 + 2);
    addrEmpty = sqlite3VdbeAddOp1(p_00,10,local_74);
    sqlite3VdbeAddOp3(p_00,0x50,iVar3,*(int *)((long)&pMWin_00->pIdxPartExpr + 4),iVar5 + -1);
  }
  sqlite3VdbeAddOp2(p_00,0x7f,p1,s.regArg);
  sqlite3VdbeAddOp3(p_00,0x80,p1,iVar4,s.regArg);
  iVar5 = sqlite3VdbeAddOp3(p_00,0x34,pMWin_00->writeMask,0,s.regArg);
  iVar1 = windowInitAccum(pParse,(Window *)pMWin_00);
  s.addrGosub = iVar1;
  if (nPeer != 0) {
    sqlite3ExprCode(pParse,*(Expr **)&pMWin_00->nRangeReg,nPeer);
    iVar1 = 0;
    if (pMWin_00->isMultiWrite == 'Y') {
      iVar1 = 3;
    }
    windowCheckValue(pParse,nPeer,iVar1);
  }
  if (addr != 0) {
    sqlite3ExprCode(pParse,*(Expr **)&pMWin_00->nErr,addr);
    iVar1 = 0;
    if (pMWin_00->isMultiWrite == 'Y') {
      iVar1 = 3;
    }
    windowCheckValue(pParse,addr,iVar1 + 1);
  }
  if (((pMWin_00->isMultiWrite != 'Y') && (pMWin_00->mayAbort == pMWin_00->hasCompound)) &&
     (nPeer != 0)) {
    iVar1 = 0x37;
    if (pMWin_00->mayAbort == 'V') {
      iVar1 = 0x39;
    }
    iVar1 = sqlite3VdbeAddOp3(p_00,iVar1,nPeer,0,addr);
    windowAggFinal((WindowCodeArg *)&regStart,0);
    sqlite3VdbeAddOp1(p_00,0x24,s.start.csr);
    windowReturnOneRow((WindowCodeArg *)&regStart);
    sqlite3VdbeAddOp1(p_00,0x92,s.start.csr);
    sqlite3VdbeAddOp2(p_00,9,0,iVar2);
    sqlite3VdbeJumpHere(p_00,iVar1);
  }
  if (((pMWin_00->mayAbort == 'V') && (pMWin_00->isMultiWrite != 'Y')) && (addr != 0)) {
    sqlite3VdbeAddOp3(p_00,0x6b,nPeer,addr,nPeer);
  }
  if (pMWin_00->mayAbort != 'Z') {
    sqlite3VdbeAddOp1(p_00,0x24,s.eDelete);
  }
  sqlite3VdbeAddOp1(p_00,0x24,s.start.csr);
  sqlite3VdbeAddOp1(p_00,0x24,s.current.csr);
  if ((local_70 != 0) && (pOrderBy_00 != (ExprList *)0x0)) {
    sqlite3VdbeAddOp3(p_00,0x50,regFlushPart,local_70,pOrderBy_00->nExpr + -1);
    sqlite3VdbeAddOp3(p_00,0x50,local_70,s.regRowid,pOrderBy_00->nExpr + -1);
    sqlite3VdbeAddOp3(p_00,0x50,local_70,s.start.reg,pOrderBy_00->nExpr + -1);
    sqlite3VdbeAddOp3(p_00,0x50,local_70,s.current.reg,pOrderBy_00->nExpr + -1);
  }
  sqlite3VdbeAddOp2(p_00,9,0,iVar2);
  sqlite3VdbeJumpHere(p_00,iVar5);
  if (local_70 != 0) {
    windowIfNewPeer(pParse,pOrderBy_00,regFlushPart,local_70,iVar2);
  }
  if (pMWin_00->mayAbort == 'V') {
    windowCodeOp((WindowCodeArg *)&regStart,3,0,0);
    if (pMWin_00->hasCompound != 'Z') {
      if (pMWin_00->isMultiWrite == 'Y') {
        iVar5 = sqlite3VdbeMakeLabel(pParse);
        iVar1 = sqlite3VdbeCurrentAddr(p_00);
        windowCodeRangeTest((WindowCodeArg *)&regStart,0x39,s.start.csr,addr,s.current.csr,iVar5);
        windowCodeOp((WindowCodeArg *)&regStart,2,nPeer,0);
        windowCodeOp((WindowCodeArg *)&regStart,1,0,0);
        sqlite3VdbeAddOp2(p_00,9,0,iVar1);
        sqlite3VdbeResolveLabel(p_00,iVar5);
      }
      else {
        windowCodeOp((WindowCodeArg *)&regStart,1,addr,0);
        windowCodeOp((WindowCodeArg *)&regStart,2,nPeer,0);
      }
    }
  }
  else if (pMWin_00->hasCompound == 'X') {
    bVar6 = false;
    if (pMWin_00->mayAbort == 'X') {
      bVar6 = pMWin_00->isMultiWrite == 'Y';
    }
    windowCodeOp((WindowCodeArg *)&regStart,3,addr,0);
    if (bVar6) {
      windowCodeOp((WindowCodeArg *)&regStart,2,nPeer,0);
    }
    windowCodeOp((WindowCodeArg *)&regStart,1,0,0);
    if (!bVar6) {
      windowCodeOp((WindowCodeArg *)&regStart,2,nPeer,0);
    }
  }
  else {
    bRPS_1 = 0;
    windowCodeOp((WindowCodeArg *)&regStart,3,0,0);
    if (pMWin_00->hasCompound != 'Z') {
      if (pMWin_00->isMultiWrite == 'Y') {
        addrStart = 0;
        iVar5 = sqlite3VdbeCurrentAddr(p_00);
        if (addr != 0) {
          addrStart = sqlite3VdbeMakeLabel(pParse);
          windowCodeRangeTest((WindowCodeArg *)&regStart,0x39,s.start.csr,addr,s.current.csr,
                              addrStart);
        }
        windowCodeOp((WindowCodeArg *)&regStart,1,0,0);
        windowCodeOp((WindowCodeArg *)&regStart,2,nPeer,0);
        if (addr != 0) {
          sqlite3VdbeAddOp2(p_00,9,0,iVar5);
          sqlite3VdbeResolveLabel(p_00,addrStart);
        }
      }
      else {
        if (addr != 0) {
          bRPS_1 = sqlite3VdbeAddOp3(p_00,0x3b,addr,0,1);
        }
        windowCodeOp((WindowCodeArg *)&regStart,1,0,0);
        windowCodeOp((WindowCodeArg *)&regStart,2,nPeer,0);
        if (addr != 0) {
          sqlite3VdbeJumpHere(p_00,bRPS_1);
        }
      }
    }
  }
  sqlite3VdbeResolveLabel(p_00,iVar2);
  sqlite3WhereEnd(pWInfo);
  if (pMWin_00->pVdbe != (Vdbe *)0x0) {
    regNew = sqlite3VdbeAddOp2(p_00,0x47,0,local_74);
    sqlite3VdbeJumpHere(p_00,addrEmpty);
  }
  s._32_8_ = s._32_8_ & 0xffffffff00000000;
  iVar5 = sqlite3VdbeAddOp1(p_00,0x24,p1);
  if (pMWin_00->hasCompound == 'X') {
    bVar6 = false;
    if (pMWin_00->mayAbort == 'X') {
      bVar6 = pMWin_00->isMultiWrite == 'Y';
    }
    windowCodeOp((WindowCodeArg *)&regStart,3,addr,0);
    if (bVar6) {
      windowCodeOp((WindowCodeArg *)&regStart,2,nPeer,0);
    }
    windowCodeOp((WindowCodeArg *)&regStart,1,0,0);
  }
  else if (pMWin_00->mayAbort == 'V') {
    windowCodeOp((WindowCodeArg *)&regStart,3,0,0);
    if (pMWin_00->isMultiWrite == 'Y') {
      addrBreak2 = sqlite3VdbeCurrentAddr(p_00);
      addrBreak = windowCodeOp((WindowCodeArg *)&regStart,2,nPeer,1);
      addrBreak3 = windowCodeOp((WindowCodeArg *)&regStart,1,0,1);
    }
    else if (pMWin_00->hasCompound == 'Z') {
      addrBreak2 = sqlite3VdbeCurrentAddr(p_00);
      addrBreak3 = windowCodeOp((WindowCodeArg *)&regStart,1,nPeer,1);
      addrBreak = windowCodeOp((WindowCodeArg *)&regStart,2,0,1);
    }
    else {
      addrBreak2 = sqlite3VdbeCurrentAddr(p_00);
      addrBreak3 = windowCodeOp((WindowCodeArg *)&regStart,1,addr,1);
      addrBreak = windowCodeOp((WindowCodeArg *)&regStart,2,nPeer,1);
    }
    sqlite3VdbeAddOp2(p_00,9,0,addrBreak2);
    sqlite3VdbeJumpHere(p_00,addrBreak);
    iVar1 = sqlite3VdbeCurrentAddr(p_00);
    iVar2 = windowCodeOp((WindowCodeArg *)&regStart,1,0,1);
    sqlite3VdbeAddOp2(p_00,9,0,iVar1);
    sqlite3VdbeJumpHere(p_00,addrBreak3);
    sqlite3VdbeJumpHere(p_00,iVar2);
  }
  else {
    windowCodeOp((WindowCodeArg *)&regStart,3,0,0);
    iVar1 = sqlite3VdbeCurrentAddr(p_00);
    iVar2 = windowCodeOp((WindowCodeArg *)&regStart,1,0,1);
    windowCodeOp((WindowCodeArg *)&regStart,2,nPeer,0);
    sqlite3VdbeAddOp2(p_00,9,0,iVar1);
    sqlite3VdbeJumpHere(p_00,iVar2);
  }
  sqlite3VdbeJumpHere(p_00,iVar5);
  sqlite3VdbeAddOp1(p_00,0x92,s.start.csr);
  if (pMWin_00->pVdbe != (Vdbe *)0x0) {
    if (pMWin_00->cookieMask != 0) {
      sqlite3VdbeAddOp2(p_00,0x47,1,pMWin_00->cookieMask);
      sqlite3VdbeAddOp2(p_00,0x47,0,pMWin_00->regRowid);
    }
    iVar5 = sqlite3VdbeCurrentAddr(p_00);
    sqlite3VdbeChangeP1(p_00,regNew,iVar5);
    sqlite3VdbeAddOp1(p_00,0x43,local_74);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WindowCodeStep(
  Parse *pParse,                  /* Parse context */
  Select *p,                      /* Rewritten SELECT statement */
  WhereInfo *pWInfo,              /* Context returned by sqlite3WhereBegin() */
  int regGosub,                   /* Register for OP_Gosub */
  int addrGosub                   /* OP_Gosub here to return each row */
){
  Window *pMWin = p->pWin;
  ExprList *pOrderBy = pMWin->pOrderBy;
  Vdbe *v = sqlite3GetVdbe(pParse);
  int csrWrite;                   /* Cursor used to write to eph. table */
  int csrInput = p->pSrc->a[0].iCursor;     /* Cursor of sub-select */
  int nInput = p->pSrc->a[0].pTab->nCol;    /* Number of cols returned by sub */
  int iInput;                               /* To iterate through sub cols */
  int addrNe;                     /* Address of OP_Ne */
  int addrGosubFlush = 0;         /* Address of OP_Gosub to flush: */
  int addrInteger = 0;            /* Address of OP_Integer */
  int addrEmpty;                  /* Address of OP_Rewind in flush: */
  int regNew;                     /* Array of registers holding new input row */
  int regRecord;                  /* regNew array in record form */
  int regNewPeer = 0;             /* Peer values for new row (part of regNew) */
  int regPeer = 0;                /* Peer values for current row */
  int regFlushPart = 0;           /* Register for "Gosub flush_partition" */
  WindowCodeArg s;                /* Context object for sub-routines */
  int lblWhereEnd;                /* Label just before sqlite3WhereEnd() code */
  int regStart = 0;               /* Value of <expr> PRECEDING */
  int regEnd = 0;                 /* Value of <expr> FOLLOWING */

  assert( pMWin->eStart==TK_PRECEDING || pMWin->eStart==TK_CURRENT
       || pMWin->eStart==TK_FOLLOWING || pMWin->eStart==TK_UNBOUNDED
  );
  assert( pMWin->eEnd==TK_FOLLOWING || pMWin->eEnd==TK_CURRENT
       || pMWin->eEnd==TK_UNBOUNDED || pMWin->eEnd==TK_PRECEDING
  );
  assert( pMWin->eExclude==0 || pMWin->eExclude==TK_CURRENT
       || pMWin->eExclude==TK_GROUP || pMWin->eExclude==TK_TIES
       || pMWin->eExclude==TK_NO
  );

  lblWhereEnd = sqlite3VdbeMakeLabel(pParse);

  /* Fill in the context object */
  memset(&s, 0, sizeof(WindowCodeArg));
  s.pParse = pParse;
  s.pMWin = pMWin;
  s.pVdbe = v;
  s.regGosub = regGosub;
  s.addrGosub = addrGosub;
  s.current.csr = pMWin->iEphCsr;
  csrWrite = s.current.csr+1;
  s.start.csr = s.current.csr+2;
  s.end.csr = s.current.csr+3;

  /* Figure out when rows may be deleted from the ephemeral table. There
  ** are four options - they may never be deleted (eDelete==0), they may
  ** be deleted as soon as they are no longer part of the window frame
  ** (eDelete==WINDOW_AGGINVERSE), they may be deleted as after the row
  ** has been returned to the caller (WINDOW_RETURN_ROW), or they may
  ** be deleted after they enter the frame (WINDOW_AGGSTEP). */
  switch( pMWin->eStart ){
    case TK_FOLLOWING:
      if( pMWin->eFrmType!=TK_RANGE
       && windowExprGtZero(pParse, pMWin->pStart)
      ){
        s.eDelete = WINDOW_RETURN_ROW;
      }
      break;
    case TK_UNBOUNDED:
      if( windowCacheFrame(pMWin)==0 ){
        if( pMWin->eEnd==TK_PRECEDING ){
          if( pMWin->eFrmType!=TK_RANGE
           && windowExprGtZero(pParse, pMWin->pEnd)
          ){
            s.eDelete = WINDOW_AGGSTEP;
          }
        }else{
          s.eDelete = WINDOW_RETURN_ROW;
        }
      }
      break;
    default:
      s.eDelete = WINDOW_AGGINVERSE;
      break;
  }

  /* Allocate registers for the array of values from the sub-query, the
  ** same values in record form, and the rowid used to insert said record
  ** into the ephemeral table.  */
  regNew = pParse->nMem+1;
  pParse->nMem += nInput;
  regRecord = ++pParse->nMem;
  s.regRowid = ++pParse->nMem;

  /* If the window frame contains an "<expr> PRECEDING" or "<expr> FOLLOWING"
  ** clause, allocate registers to store the results of evaluating each
  ** <expr>.  */
  if( pMWin->eStart==TK_PRECEDING || pMWin->eStart==TK_FOLLOWING ){
    regStart = ++pParse->nMem;
  }
  if( pMWin->eEnd==TK_PRECEDING || pMWin->eEnd==TK_FOLLOWING ){
    regEnd = ++pParse->nMem;
  }

  /* If this is not a "ROWS BETWEEN ..." frame, then allocate arrays of
  ** registers to store copies of the ORDER BY expressions (peer values)
  ** for the main loop, and for each cursor (start, current and end). */
  if( pMWin->eFrmType!=TK_ROWS ){
    int nPeer = (pOrderBy ? pOrderBy->nExpr : 0);
    regNewPeer = regNew + pMWin->nBufferCol;
    if( pMWin->pPartition ) regNewPeer += pMWin->pPartition->nExpr;
    regPeer = pParse->nMem+1;       pParse->nMem += nPeer;
    s.start.reg = pParse->nMem+1;   pParse->nMem += nPeer;
    s.current.reg = pParse->nMem+1; pParse->nMem += nPeer;
    s.end.reg = pParse->nMem+1;     pParse->nMem += nPeer;
  }

  /* Load the column values for the row returned by the sub-select
  ** into an array of registers starting at regNew. Assemble them into
  ** a record in register regRecord. */
  for(iInput=0; iInput<nInput; iInput++){
    sqlite3VdbeAddOp3(v, OP_Column, csrInput, iInput, regNew+iInput);
  }
  sqlite3VdbeAddOp3(v, OP_MakeRecord, regNew, nInput, regRecord);

  /* An input row has just been read into an array of registers starting
  ** at regNew. If the window has a PARTITION clause, this block generates
  ** VM code to check if the input row is the start of a new partition.
  ** If so, it does an OP_Gosub to an address to be filled in later. The
  ** address of the OP_Gosub is stored in local variable addrGosubFlush. */
  if( pMWin->pPartition ){
    int addr;
    ExprList *pPart = pMWin->pPartition;
    int nPart = pPart->nExpr;
    int regNewPart = regNew + pMWin->nBufferCol;
    KeyInfo *pKeyInfo = sqlite3KeyInfoFromExprList(pParse, pPart, 0, 0);

    regFlushPart = ++pParse->nMem;
    addr = sqlite3VdbeAddOp3(v, OP_Compare, regNewPart, pMWin->regPart, nPart);
    sqlite3VdbeAppendP4(v, (void*)pKeyInfo, P4_KEYINFO);
    sqlite3VdbeAddOp3(v, OP_Jump, addr+2, addr+4, addr+2);
    VdbeCoverageEqNe(v);
    addrGosubFlush = sqlite3VdbeAddOp1(v, OP_Gosub, regFlushPart);
    VdbeComment((v, "call flush_partition"));
    sqlite3VdbeAddOp3(v, OP_Copy, regNewPart, pMWin->regPart, nPart-1);
  }

  /* Insert the new row into the ephemeral table */
  sqlite3VdbeAddOp2(v, OP_NewRowid, csrWrite, s.regRowid);
  sqlite3VdbeAddOp3(v, OP_Insert, csrWrite, regRecord, s.regRowid);
  addrNe = sqlite3VdbeAddOp3(v, OP_Ne, pMWin->regOne, 0, s.regRowid);
  VdbeCoverageNeverNull(v);

  /* This block is run for the first row of each partition */
  s.regArg = windowInitAccum(pParse, pMWin);

  if( regStart ){
    sqlite3ExprCode(pParse, pMWin->pStart, regStart);
    windowCheckValue(pParse, regStart, 0 + (pMWin->eFrmType==TK_RANGE?3:0));
  }
  if( regEnd ){
    sqlite3ExprCode(pParse, pMWin->pEnd, regEnd);
    windowCheckValue(pParse, regEnd, 1 + (pMWin->eFrmType==TK_RANGE?3:0));
  }

  if( pMWin->eFrmType!=TK_RANGE && pMWin->eStart==pMWin->eEnd && regStart ){
    int op = ((pMWin->eStart==TK_FOLLOWING) ? OP_Ge : OP_Le);
    int addrGe = sqlite3VdbeAddOp3(v, op, regStart, 0, regEnd);
    VdbeCoverageNeverNullIf(v, op==OP_Ge); /* NeverNull because bound <expr> */
    VdbeCoverageNeverNullIf(v, op==OP_Le); /*   values previously checked */
    windowAggFinal(&s, 0);
    sqlite3VdbeAddOp1(v, OP_Rewind, s.current.csr);
    windowReturnOneRow(&s);
    sqlite3VdbeAddOp1(v, OP_ResetSorter, s.current.csr);
    sqlite3VdbeAddOp2(v, OP_Goto, 0, lblWhereEnd);
    sqlite3VdbeJumpHere(v, addrGe);
  }
  if( pMWin->eStart==TK_FOLLOWING && pMWin->eFrmType!=TK_RANGE && regEnd ){
    assert( pMWin->eEnd==TK_FOLLOWING );
    sqlite3VdbeAddOp3(v, OP_Subtract, regStart, regEnd, regStart);
  }

  if( pMWin->eStart!=TK_UNBOUNDED ){
    sqlite3VdbeAddOp1(v, OP_Rewind, s.start.csr);
  }
  sqlite3VdbeAddOp1(v, OP_Rewind, s.current.csr);
  sqlite3VdbeAddOp1(v, OP_Rewind, s.end.csr);
  if( regPeer && pOrderBy ){
    sqlite3VdbeAddOp3(v, OP_Copy, regNewPeer, regPeer, pOrderBy->nExpr-1);
    sqlite3VdbeAddOp3(v, OP_Copy, regPeer, s.start.reg, pOrderBy->nExpr-1);
    sqlite3VdbeAddOp3(v, OP_Copy, regPeer, s.current.reg, pOrderBy->nExpr-1);
    sqlite3VdbeAddOp3(v, OP_Copy, regPeer, s.end.reg, pOrderBy->nExpr-1);
  }

  sqlite3VdbeAddOp2(v, OP_Goto, 0, lblWhereEnd);

  sqlite3VdbeJumpHere(v, addrNe);

  /* Beginning of the block executed for the second and subsequent rows. */
  if( regPeer ){
    windowIfNewPeer(pParse, pOrderBy, regNewPeer, regPeer, lblWhereEnd);
  }
  if( pMWin->eStart==TK_FOLLOWING ){
    windowCodeOp(&s, WINDOW_AGGSTEP, 0, 0);
    if( pMWin->eEnd!=TK_UNBOUNDED ){
      if( pMWin->eFrmType==TK_RANGE ){
        int lbl = sqlite3VdbeMakeLabel(pParse);
        int addrNext = sqlite3VdbeCurrentAddr(v);
        windowCodeRangeTest(&s, OP_Ge, s.current.csr, regEnd, s.end.csr, lbl);
        windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
        windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 0);
        sqlite3VdbeAddOp2(v, OP_Goto, 0, addrNext);
        sqlite3VdbeResolveLabel(v, lbl);
      }else{
        windowCodeOp(&s, WINDOW_RETURN_ROW, regEnd, 0);
        windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
      }
    }
  }else
  if( pMWin->eEnd==TK_PRECEDING ){
    int bRPS = (pMWin->eStart==TK_PRECEDING && pMWin->eFrmType==TK_RANGE);
    windowCodeOp(&s, WINDOW_AGGSTEP, regEnd, 0);
    if( bRPS ) windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
    windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 0);
    if( !bRPS ) windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
  }else{
    int addr = 0;
    windowCodeOp(&s, WINDOW_AGGSTEP, 0, 0);
    if( pMWin->eEnd!=TK_UNBOUNDED ){
      if( pMWin->eFrmType==TK_RANGE ){
        int lbl = 0;
        addr = sqlite3VdbeCurrentAddr(v);
        if( regEnd ){
          lbl = sqlite3VdbeMakeLabel(pParse);
          windowCodeRangeTest(&s, OP_Ge, s.current.csr, regEnd, s.end.csr, lbl);
        }
        windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 0);
        windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
        if( regEnd ){
          sqlite3VdbeAddOp2(v, OP_Goto, 0, addr);
          sqlite3VdbeResolveLabel(v, lbl);
        }
      }else{
        if( regEnd ){
          addr = sqlite3VdbeAddOp3(v, OP_IfPos, regEnd, 0, 1);
          VdbeCoverage(v);
        }
        windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 0);
        windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
        if( regEnd ) sqlite3VdbeJumpHere(v, addr);
      }
    }
  }

  /* End of the main input loop */
  sqlite3VdbeResolveLabel(v, lblWhereEnd);
  sqlite3WhereEnd(pWInfo);

  /* Fall through */
  if( pMWin->pPartition ){
    addrInteger = sqlite3VdbeAddOp2(v, OP_Integer, 0, regFlushPart);
    sqlite3VdbeJumpHere(v, addrGosubFlush);
  }

  s.regRowid = 0;
  addrEmpty = sqlite3VdbeAddOp1(v, OP_Rewind, csrWrite);
  VdbeCoverage(v);
  if( pMWin->eEnd==TK_PRECEDING ){
    int bRPS = (pMWin->eStart==TK_PRECEDING && pMWin->eFrmType==TK_RANGE);
    windowCodeOp(&s, WINDOW_AGGSTEP, regEnd, 0);
    if( bRPS ) windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
    windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 0);
  }else if( pMWin->eStart==TK_FOLLOWING ){
    int addrStart;
    int addrBreak1;
    int addrBreak2;
    int addrBreak3;
    windowCodeOp(&s, WINDOW_AGGSTEP, 0, 0);
    if( pMWin->eFrmType==TK_RANGE ){
      addrStart = sqlite3VdbeCurrentAddr(v);
      addrBreak2 = windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 1);
      addrBreak1 = windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 1);
    }else
    if( pMWin->eEnd==TK_UNBOUNDED ){
      addrStart = sqlite3VdbeCurrentAddr(v);
      addrBreak1 = windowCodeOp(&s, WINDOW_RETURN_ROW, regStart, 1);
      addrBreak2 = windowCodeOp(&s, WINDOW_AGGINVERSE, 0, 1);
    }else{
      assert( pMWin->eEnd==TK_FOLLOWING );
      addrStart = sqlite3VdbeCurrentAddr(v);
      addrBreak1 = windowCodeOp(&s, WINDOW_RETURN_ROW, regEnd, 1);
      addrBreak2 = windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 1);
    }
    sqlite3VdbeAddOp2(v, OP_Goto, 0, addrStart);
    sqlite3VdbeJumpHere(v, addrBreak2);
    addrStart = sqlite3VdbeCurrentAddr(v);
    addrBreak3 = windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 1);
    sqlite3VdbeAddOp2(v, OP_Goto, 0, addrStart);
    sqlite3VdbeJumpHere(v, addrBreak1);
    sqlite3VdbeJumpHere(v, addrBreak3);
  }else{
    int addrBreak;
    int addrStart;
    windowCodeOp(&s, WINDOW_AGGSTEP, 0, 0);
    addrStart = sqlite3VdbeCurrentAddr(v);
    addrBreak = windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 1);
    windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
    sqlite3VdbeAddOp2(v, OP_Goto, 0, addrStart);
    sqlite3VdbeJumpHere(v, addrBreak);
  }
  sqlite3VdbeJumpHere(v, addrEmpty);

  sqlite3VdbeAddOp1(v, OP_ResetSorter, s.current.csr);
  if( pMWin->pPartition ){
    if( pMWin->regStartRowid ){
      sqlite3VdbeAddOp2(v, OP_Integer, 1, pMWin->regStartRowid);
      sqlite3VdbeAddOp2(v, OP_Integer, 0, pMWin->regEndRowid);
    }
    sqlite3VdbeChangeP1(v, addrInteger, sqlite3VdbeCurrentAddr(v));
    sqlite3VdbeAddOp1(v, OP_Return, regFlushPart);
  }
}